

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::detail::Dispatch_Engine::get_object
          (Dispatch_Engine *this,string_view name,atomic_uint_fast32_t *t_loc,Stack_Holder *t_holder
          )

{
  pointer t_hint;
  long lVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view t_name;
  long lVar2;
  bool bVar3;
  const_iterator cVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Dispatch_Engine *this_00;
  long in_R9;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  Boxed_Value BVar9;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view name_local;
  shared_lock<chaiscript::detail::threading::shared_mutex> l;
  pair<unsigned_long,_chaiscript::Boxed_Value> obj;
  
  name_local._M_len = (size_t)name._M_str;
  this_00 = (Dispatch_Engine *)name._M_len;
  t_hint = (t_holder->stacks).
           super__Vector_base<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>,_std::allocator<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  name_local._M_str = (char *)t_loc;
  if (t_hint == (pointer)0x0) {
    lVar1 = *(long *)(in_R9 + 8);
    __x._M_str = (char *)t_loc;
    __x._M_len = name_local._M_len;
    lVar2 = *(long *)(lVar1 + -0x10);
    while (lVar8 = lVar2, lVar8 != *(long *)(lVar1 + -0x18)) {
      puVar6 = *(undefined8 **)(lVar8 + -0x18);
      lVar7 = -(long)puVar6;
      for (; lVar2 = lVar8 + -0x20, puVar6 != *(undefined8 **)(lVar8 + -0x10); puVar6 = puVar6 + 6)
      {
        __y._M_str = (char *)*puVar6;
        __y._M_len = puVar6[1];
        bVar3 = std::operator==(__x,__y);
        if (bVar3) {
          LOCK();
          (t_holder->stacks).
          super__Vector_base<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>,_std::allocator<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((*(long *)(lVar1 + -0x10) - lVar8) * 0x800 | 0xc0000000U |
                        -(lVar7 + *(long *)(lVar8 + -0x18)) / 0x30);
          UNLOCK();
          goto LAB_003c0d09;
        }
        lVar7 = lVar7 + -0x30;
      }
    }
    LOCK();
    (t_holder->stacks).
    super__Vector_base<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>,_std::allocator<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x80000000;
    UNLOCK();
  }
  else if (((uint)t_hint >> 0x1e & 1) != 0) {
    puVar6 = (undefined8 *)
             (*(long *)(*(long *)(*(long *)(in_R9 + 8) + -0x10) + 8 +
                       ((ulong)(~(uint)t_hint >> 0xb & 0x1ffe0) | 0xfffffffffffe0000)) +
             ((ulong)t_hint & 0xffff) * 0x30);
LAB_003c0d09:
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
               (puVar6 + 4));
    _Var5._M_pi = extraout_RDX;
    goto LAB_003c0d57;
  }
  l._M_owns = true;
  l._M_pm = (mutex_type *)this_00;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this_00);
  cVar4 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
                      *)&(this_00->m_state).m_global_objects,&name_local);
  if ((_Rb_tree_header *)cVar4._M_node ==
      &(this_00->m_state).m_global_objects._M_t._M_impl.super__Rb_tree_header) {
    t_name._M_str = name_local._M_str;
    t_name._M_len = name_local._M_len;
    get_function_object_int(&obj,this_00,t_name,(size_t)t_hint);
    if ((pointer)obj.first != t_hint) {
      LOCK();
      (t_holder->stacks).
      super__Vector_base<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>,_std::allocator<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)obj.first;
      UNLOCK();
    }
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
               &obj.second);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&obj.second.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
               (cVar4._M_node + 2));
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&l);
  _Var5._M_pi = extraout_RDX_00;
LAB_003c0d57:
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value get_object(std::string_view name, std::atomic_uint_fast32_t &t_loc, Stack_Holder &t_holder) const {
        enum class Loc : uint_fast32_t {
          located = 0x80000000,
          is_local = 0x40000000,
          stack_mask = 0x0FFF0000,
          loc_mask = 0x0000FFFF
        };

        uint_fast32_t loc = t_loc;

        if (loc == 0) {
          auto &stack = get_stack_data(t_holder);

          // Is it in the stack?
          for (auto stack_elem = stack.rbegin(); stack_elem != stack.rend(); ++stack_elem) {
            for (auto s = stack_elem->begin(); s != stack_elem->end(); ++s) {
              if (s->first == name) {
                t_loc = static_cast<uint_fast32_t>(std::distance(stack.rbegin(), stack_elem) << 16)
                    | static_cast<uint_fast32_t>(std::distance(stack_elem->begin(), s)) | static_cast<uint_fast32_t>(Loc::located)
                    | static_cast<uint_fast32_t>(Loc::is_local);
                return s->second;
              }
            }
          }

          t_loc = static_cast<uint_fast32_t>(Loc::located);
        } else if ((loc & static_cast<uint_fast32_t>(Loc::is_local)) != 0u) {
          auto &stack = get_stack_data(t_holder);

          return stack[stack.size() - 1 - ((loc & static_cast<uint_fast32_t>(Loc::stack_mask)) >> 16)].at_index(
              loc & static_cast<uint_fast32_t>(Loc::loc_mask));
        }

        // Is the value we are looking for a global or function?
        chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

        const auto itr = m_state.m_global_objects.find(name);
        if (itr != m_state.m_global_objects.end()) {
          return itr->second;
        }

        // no? is it a function object?
        auto obj = get_function_object_int(name, loc);
        if (obj.first != loc) {
          t_loc = uint_fast32_t(obj.first);
        }

        return obj.second;
      }